

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::has_active_builtin(Compiler *this,BuiltIn builtin,StorageClass storage)

{
  bool bVar1;
  long lVar2;
  
  if (storage == StorageClassInput) {
    lVar2 = 0xa78;
  }
  else {
    if (storage != StorageClassOutput) {
      return false;
    }
    lVar2 = 0xab8;
  }
  bVar1 = Bitset::get((Bitset *)((this->ir).ids.stack_storage.aligned_char + lVar2 + -0x40),builtin)
  ;
  return bVar1;
}

Assistant:

bool Compiler::has_active_builtin(BuiltIn builtin, StorageClass storage) const
{
	const Bitset *flags;
	switch (storage)
	{
	case StorageClassInput:
		flags = &active_input_builtins;
		break;
	case StorageClassOutput:
		flags = &active_output_builtins;
		break;

	default:
		return false;
	}
	return flags->get(builtin);
}